

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::TimeType::printTo(TimeType *this,ostream *out)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(out,"TimeType(");
  poVar1 = std::operator<<(out,"isAdjustedToUTC=");
  duckdb_apache::thrift::to_string<bool>(&local_40,&this->isAdjustedToUTC);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"unit=");
  duckdb_apache::thrift::to_string<duckdb_parquet::TimeUnit>(&local_40,&this->unit);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(out,")");
  return;
}

Assistant:

void TimeType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "TimeType(";
  out << "isAdjustedToUTC=" << to_string(isAdjustedToUTC);
  out << ", " << "unit=" << to_string(unit);
  out << ")";
}